

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O3

void fsnav_linal_mul_u(double *res,double *v,double *u,size_t m,size_t n)

{
  ulong uVar1;
  long lVar2;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  double dVar13;
  double *local_48;
  
  uVar1 = m * n;
  if (uVar1 != 0) {
    uVar5 = uVar1 - 1;
    local_48 = v + uVar1;
    do {
      if (n != 0) {
        uVar10 = 0;
        pdVar3 = local_48;
        uVar8 = 0;
        lVar11 = ((n + 1) * n >> 1) - 1;
        do {
          lVar9 = uVar5 - uVar10;
          dVar13 = v[lVar9] * u[lVar11];
          res[lVar9] = dVar13;
          uVar4 = ~uVar10;
          if (1 < n - uVar10) {
            lVar7 = lVar11 + uVar4;
            uVar6 = 1;
            lVar2 = -2;
            do {
              dVar13 = dVar13 + pdVar3[lVar2] * u[lVar7];
              res[lVar9] = dVar13;
              uVar6 = uVar6 + 1;
              lVar7 = lVar7 + uVar8 + lVar2;
              lVar2 = lVar2 + -1;
            } while (uVar6 < n - uVar10);
          }
          lVar11 = lVar11 + uVar8 + -2;
          uVar10 = uVar10 + 1;
          pdVar3 = pdVar3 + -1;
          uVar8 = uVar4;
        } while (uVar10 != n);
      }
      bVar12 = n <= uVar5;
      uVar5 = uVar5 - n;
    } while ((bVar12) && (local_48 = local_48 + -n, uVar5 < uVar1));
  }
  return;
}

Assistant:

void fsnav_linal_mul_u(double* res, double* v, double* u, const size_t m, const size_t n)
{
	size_t 
		i, j, k, k0, r, r0, 
		nj, mn, nn1;

	mn = m*n;
	nn1 = n*(n+1)/2 - 1;
	for (r0 = mn-1; r0 < mn; r0 -= n) {
		for (j = 0, k0 = nn1; j < n; k0 -= j+2, j++) {
			r = r0 - j;
			nj = n - j;
			res[r] = v[r]*u[k0];
			for (i = 1, k = k0-j-1; i < nj; i++, k -= i+j)
				res[r] += v[r-i]*u[k];
		}
		if (r0 < n)
			break;
	}		
}